

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeGetRootInfo(void *cvode_mem,int *rootsfound)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int nrt;
  int i;
  CVodeMem cv_mem;
  int local_24;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetRootInfo","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x578);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      *(undefined4 *)(in_RSI + (long)local_24 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x580) + (long)local_24 * 4);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetRootInfo(void *cvode_mem, int *rootsfound)
{
  CVodeMem cv_mem;
  int i, nrt;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetRootInfo", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  nrt = cv_mem->cv_nrtfn;

  for (i=0; i<nrt; i++) rootsfound[i] = cv_mem->cv_iroots[i];

  return(CV_SUCCESS);
}